

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

bool is_unicode_string(string *v,string *str)

{
  bool bVar1;
  string local_70 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *str_local;
  string *v_local;
  
  local_20 = str;
  str_local = v;
  std::__cxx11::string::substr((ulong)&local_40,(ulong)v);
  bVar1 = std::operator==(&local_40,"u:");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)str_local);
    std::__cxx11::string::operator=((string *)local_20,local_70);
    std::__cxx11::string::~string(local_70);
  }
  return bVar1;
}

Assistant:

static bool
is_unicode_string(std::string const& v, std::string& str)
{
    if (v.substr(0, 2) == "u:") {
        str = v.substr(2);
        return true;
    }
    return false;
}